

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939cat.c
# Opt level: O0

int j1939cat_recv_err(j1939cat_priv *priv)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int *in_RDI;
  bool bVar4;
  msghdr msg;
  int ret;
  cmsghdr *cm;
  char control [200];
  cmsghdr *cm_00;
  j1939cat_priv *priv_00;
  j1939cat_priv *priv_01;
  cmsghdr *local_e0;
  cmsghdr local_d8 [12];
  int *local_10;
  
  priv_00 = (j1939cat_priv *)0x0;
  cm_00 = local_d8;
  priv_01 = (j1939cat_priv *)0xc8;
  local_10 = in_RDI;
  sVar2 = recvmsg(*in_RDI,(msghdr *)&stack0xfffffffffffffee0,0x2000);
  if ((int)sVar2 == -1) {
    piVar3 = __errno_location();
    err(1,"recvmsg error notification: %i",*piVar3);
  }
  local_10[0x1c] = 0;
  local_10[0x1d] = 0;
  local_10[0x1e] = 0;
  local_10[0x1f] = 0;
  local_e0 = (cmsghdr *)cm_00;
  if (priv_01 < (j1939cat_priv *)0x10) {
    cm_00 = (cmsghdr *)0x0;
    local_e0 = (cmsghdr *)cm_00;
  }
  while( true ) {
    bVar4 = false;
    if (local_e0 != (cmsghdr *)0x0) {
      bVar4 = local_e0->cmsg_len != 0;
    }
    if (!bVar4) break;
    j1939cat_parse_cm(priv_00,cm_00);
    if ((*(long *)(local_10 + 0x1c) != 0) && (*(long *)(local_10 + 0x1e) != 0)) {
      iVar1 = j1939cat_extract_serr(priv_01);
      return iVar1;
    }
    local_e0 = __cmsg_nxthdr((msghdr *)&stack0xfffffffffffffee0,local_e0);
  }
  return 0;
}

Assistant:

static int j1939cat_recv_err(struct j1939cat_priv *priv)
{
	char control[200];
	struct cmsghdr *cm;
	int ret;
	struct msghdr msg = {
		.msg_control = control,
		.msg_controllen = sizeof(control),
	};

	ret = recvmsg(priv->sock, &msg, MSG_ERRQUEUE);
	if (ret == -1)
		err(EXIT_FAILURE, "recvmsg error notification: %i", errno);
	if (msg.msg_flags & MSG_CTRUNC)
		err(EXIT_FAILURE, "recvmsg error notification: truncated");

	priv->serr = NULL;
	priv->tss = NULL;

	for (cm = CMSG_FIRSTHDR(&msg); cm && cm->cmsg_len;
	     cm = CMSG_NXTHDR(&msg, cm)) {
		j1939cat_parse_cm(priv, cm);
		if (priv->serr && priv->tss)
			return j1939cat_extract_serr(priv);
	}

	return 0;
}